

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderDNA.cpp
# Opt level: O0

void Assimp::Blender::DNA::ExtractArraySize(string *out,size_t *array_sizes)

{
  uint uVar1;
  long lVar2;
  char *pcVar3;
  size_type pos;
  size_t *array_sizes_local;
  string *out_local;
  
  array_sizes[1] = 1;
  *array_sizes = 1;
  lVar2 = ::std::__cxx11::string::find((char)out,0x5b);
  if (lVar2 != -1) {
    pcVar3 = (char *)::std::__cxx11::string::operator[]((ulong)out);
    uVar1 = strtoul10(pcVar3,(char **)0x0);
    *array_sizes = (ulong)uVar1;
    lVar2 = ::std::__cxx11::string::find((char)out,0x5b);
    if (lVar2 != -1) {
      pcVar3 = (char *)::std::__cxx11::string::operator[]((ulong)out);
      uVar1 = strtoul10(pcVar3,(char **)0x0);
      array_sizes[1] = (ulong)uVar1;
    }
  }
  return;
}

Assistant:

void  DNA :: ExtractArraySize(
    const std::string& out,
    size_t array_sizes[2]
)
{
    array_sizes[0] = array_sizes[1] = 1;
    std::string::size_type pos = out.find('[');
    if (pos++ == std::string::npos) {
        return;
    }
    array_sizes[0] = strtoul10(&out[pos]);

    pos = out.find('[',pos);
    if (pos++ == std::string::npos) {
        return;
    }
    array_sizes[1] = strtoul10(&out[pos]);
}